

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCall
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Call *curr)

{
  Type *this_00;
  array<wasm::Literal,_1UL> *this_01;
  char cVar1;
  long lVar2;
  Literal *pLVar3;
  Name NVar4;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_168;
  Literals local_148;
  undefined1 auStack_108 [8];
  Literals arguments;
  undefined1 local_c8 [8];
  Flow flow;
  Literal target;
  Literals newArguments;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_108 = (undefined1  [8])0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_c8,&this->super_ExpressionRunner<wasm::ModuleRunner>,&curr->operands,
             (Literals *)auStack_108);
  if (CONCAT44(flow.breakTo.super_IString.str._M_len._4_4_,
               (undefined4)flow.breakTo.super_IString.str._M_len) == 0) {
    NVar4.super_IString.str._M_str = (char *)(curr->target).super_IString.str._M_len;
    NVar4.super_IString.str._M_len = (size_t)this->wasm;
    lVar2 = ::wasm::Module::getFunction(NVar4);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    target.type.id = (uintptr_t)(this->super_ExpressionRunner<wasm::ModuleRunner>).module;
    cVar1 = ::wasm::Intrinsics::isCallWithoutEffects((Function *)&target.type);
    if (cVar1 == '\0') {
      if (*(long *)(lVar2 + 0x20) == 0) {
        callFunctionInternal
                  ((Literals *)&target.type,this,(Name)(curr->target).super_IString.str,
                   (Literals *)auStack_108);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             target.type.id;
        ::wasm::Literal::operator=
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems,(Literal *)&newArguments);
      }
      else {
        (*this->externalInterface->_vptr_ExternalInterface[4])
                  (&target.type,this->externalInterface,lVar2,auStack_108);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             target.type.id;
        ::wasm::Literal::operator=
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems,(Literal *)&newArguments);
      }
      local_148.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_start;
      local_148.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 =
           (int64_t)(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_148.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
      str._M_str = (char *)(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                           flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)newArguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           newArguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           newArguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      newArguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      newArguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      newArguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&local_148);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &newArguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    }
    else {
      target.type.id = (uintptr_t)auStack_108;
      ::wasm::Literal::Literal((Literal *)&newArguments,(Literal *)&arguments);
      this_00 = &newArguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)this_00,
                 (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      pLVar3 = SmallVector<wasm::Literal,_1UL>::back
                         ((SmallVector<wasm::Literal,_1UL> *)&target.type);
      ::wasm::Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,pLVar3);
      SmallVector<wasm::Literal,_1UL>::pop_back((SmallVector<wasm::Literal,_1UL> *)&target.type);
      NVar4 = Literal::getFunc((Literal *)&flow.breakTo.super_IString.str._M_str);
      callFunctionInternal(&local_148,this,NVar4,(Literals *)&target.type);
      this_01 = &local_148.super_SmallVector<wasm::Literal,_1UL>.fixed;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           local_148.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      ::wasm::Literal::operator=
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,this_01->_M_elems);
      local_168.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_168.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_148.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_148.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_148.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_148.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_168);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                (&local_148.super_SmallVector<wasm::Literal,_1UL>.flexible);
      ::wasm::Literal::~Literal(this_01->_M_elems);
      ::wasm::Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)this_00);
    }
    ::wasm::Literal::~Literal((Literal *)&newArguments);
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)RETURN_FLOW;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = RETURN_FLOW._4_4_;
    flow.breakTo.super_IString.str._M_len._0_4_ = _getStruct;
    flow.breakTo.super_IString.str._M_len._4_4_ = uRam00000000001cc214;
    if (curr->isReturn != true) goto LAB_00184742;
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_c8;
    ::wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_len =
       flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_len + 4) =
       flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_str =
       (undefined4)flow.breakTo.super_IString.str._M_len;
  *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_str + 4) =
       flow.breakTo.super_IString.str._M_len._4_4_;
LAB_00184742:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&flow);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&arguments);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCall(Call* curr) {
    NOTE_ENTER("Call");
    NOTE_NAME(curr->target);
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    auto* func = wasm.getFunction(curr->target);
    Flow ret;
    if (Intrinsics(*self()->getModule()).isCallWithoutEffects(func)) {
      // The call.without.effects intrinsic is a call to an import that actually
      // calls the given function reference that is the final argument.
      auto newArguments = arguments;
      auto target = newArguments.back();
      newArguments.pop_back();
      ret.values = callFunctionInternal(target.getFunc(), newArguments);
    } else if (func->imported()) {
      ret.values = externalInterface->callImport(func, arguments);
    } else {
      ret.values = callFunctionInternal(curr->target, arguments);
    }
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    // TODO: make this a proper tail call (return first)
    if (curr->isReturn) {
      ret.breakTo = RETURN_FLOW;
    }
    return ret;
  }